

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall
Assimp::STEP::InternGenericConvert<long>::operator()
          (InternGenericConvert<long> *this,long *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *in,DB *param_3)

{
  element_type *peVar1;
  PrimitiveDataType *this_00;
  long *plVar2;
  bad_cast *anon_var_0;
  DB *param_3_local;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *in_local;
  long *out_local;
  InternGenericConvert<long> *this_local;
  
  peVar1 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in);
  this_00 = (PrimitiveDataType *)
            __dynamic_cast(peVar1,&EXPRESS::DataType::typeinfo,
                           &EXPRESS::PrimitiveDataType<long>::typeinfo,0);
  if (this_00 == (PrimitiveDataType *)0x0) {
    __cxa_bad_cast();
  }
  plVar2 = EXPRESS::PrimitiveDataType::operator_cast_to_long_(this_00);
  *out = *plVar2;
  return;
}

Assistant:

void operator()(T& out, const std::shared_ptr< const EXPRESS::DataType >& in, const STEP::DB& /*db*/) {
            try{
                out = dynamic_cast< const typename PickBaseType<T>::Type& > ( *in );
            } catch(std::bad_cast&) {
                throw TypeError("type error reading literal field");
            }
        }